

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O0

void __thiscall QTabWidgetPrivate::showTab(QTabWidgetPrivate *this,int index)

{
  int iVar1;
  int in_ESI;
  QTabWidgetPrivate *in_RDI;
  QTabWidget *q;
  int index_00;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  q_func(in_RDI);
  index_00 = (int)((ulong)in_RDI >> 0x20);
  iVar2 = in_ESI;
  iVar1 = QStackedWidget::count((QStackedWidget *)0x6e6def);
  if ((iVar2 < iVar1) && (-1 < in_ESI)) {
    QStackedWidget::setCurrentIndex
              ((QStackedWidget *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),index_00);
  }
  QTabWidget::currentChanged((QTabWidget *)0x6e6e22,index_00);
  return;
}

Assistant:

void QTabWidgetPrivate::showTab(int index)
{
    Q_Q(QTabWidget);
    if (index < stack->count() && index >= 0)
        stack->setCurrentIndex(index);
    emit q->currentChanged(index);
}